

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void int_linear_imp<0>(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  BoolView *_r;
  vec<IntVar_*> *_x;
  char *pcVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  vec<IntVar_*> *in_RSI;
  vec<int> *in_RDI;
  undefined8 in_R8;
  uint i;
  vec<int> b;
  BoolView *in_stack_fffffffffffffe18;
  BoolView *in_stack_fffffffffffffe20;
  FILE *__stream;
  int *in_stack_fffffffffffffe28;
  vec<int> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffeb0;
  vec<int> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  BoolView *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int iVar5;
  vec<IntVar_*> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  LinearGE<0,_1> *in_stack_ffffffffffffff00;
  LinearGE<0,_1> *this;
  undefined1 local_88 [23];
  undefined1 local_71;
  undefined1 local_59;
  int local_38;
  uint local_34;
  BoolView *in_stack_ffffffffffffffd8;
  
  vec<int>::vec((vec<int> *)&stack0xffffffffffffffd0);
  local_34 = 0;
  while( true ) {
    uVar1 = local_34;
    uVar2 = vec<int>::size(in_RDI);
    iVar5 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (uVar2 <= uVar1) break;
    piVar3 = vec<int>::operator[](in_RDI,local_34);
    local_38 = -*piVar3;
    vec<int>::push(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_34 = local_34 + 1;
  }
  switch(in_EDX) {
  case 0:
    operator_new(0x88);
    local_59 = 1;
    this = (LinearGE<0,_1> *)&stack0xffffffffffffffa8;
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    iVar5 = (int)((ulong)in_RDI >> 0x20);
    LinearGE<0,_1>::LinearGE
              (this,(vec<int> *)CONCAT44(in_ECX,in_stack_fffffffffffffef8),in_RSI,iVar5,
               in_stack_fffffffffffffee0);
    local_59 = 0;
    BoolView::~BoolView((BoolView *)0x262b0a);
    _r = (BoolView *)operator_new(0x88);
    local_71 = 1;
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    LinearGE<0,_1>::LinearGE
              (this,(vec<int> *)CONCAT44(in_ECX,in_stack_fffffffffffffef8),in_RSI,iVar5,_r);
    local_71 = 0;
    BoolView::~BoolView((BoolView *)0x262ba6);
    break;
  case 1:
    _x = (vec<IntVar_*> *)operator_new(0x58);
    iVar5 = (int)((ulong)local_88 >> 0x20);
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    LinearNE<0,_1,_1>::LinearNE
              ((LinearNE<0,_1,_1> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,_x,iVar5,
               (BoolView *)CONCAT44(in_ECX,in_stack_fffffffffffffeb0));
    BoolView::~BoolView((BoolView *)0x262cec);
    break;
  case 2:
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    int_linear_imp<0>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),SUB84(in_R8,4),
                      (uint)in_R8,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x262d99);
    break;
  case 3:
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    int_linear_imp<0>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),SUB84(in_R8,4),
                      (uint)in_R8,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x262e2c);
    break;
  case 4:
    operator_new(0x88);
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    LinearGE<0,_1>::LinearGE
              (in_stack_ffffffffffffff00,
               (vec<int> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef0,iVar5,in_stack_fffffffffffffee0);
    BoolView::~BoolView((BoolView *)0x262ee3);
    break;
  case 5:
    BoolView::BoolView(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    int_linear_imp<0>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),SUB84(in_R8,4),
                      (uint)in_R8,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x262f91);
    break;
  default:
    __stream = _stderr;
    pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                     ,0x2f);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
      ;
    }
    else {
      pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                       ,0x2f);
      pcVar4 = pcVar4 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar4,0x17e);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  vec<int>::~vec((vec<int> *)in_stack_fffffffffffffe20);
  return;
}

Assistant:

void int_linear_imp(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, BoolView r) {
	vec<int> b;
	for (unsigned int i = 0; i < a.size(); i++) {
		b.push(-a[i]);
	}
	switch (t) {
		case IRT_EQ:
			new LinearGE<S, 1>(a, x, c, r);
			new LinearGE<S, 1>(b, x, -c, r);
			break;
		case IRT_NE:
			new LinearNE<2 * S, 2 * S + 1, 1>(a, x, c, r);
			break;
		case IRT_LE:
			int_linear_imp<S>(b, x, IRT_GE, -c, r);
			break;
		case IRT_LT:
			int_linear_imp<S>(b, x, IRT_GE, -c + 1, r);
			break;
		case IRT_GE:
			new LinearGE<S, 1>(a, x, c, r);
			break;
		case IRT_GT:
			int_linear_imp<S>(a, x, IRT_GE, c + 1, r);
			break;
		default:
			NEVER;
	}
}